

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Scene *pSVar11;
  Ref<embree::Geometry> *pRVar12;
  Geometry *pGVar13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  undefined1 auVar24 [32];
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  ulong *puVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar76 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  uint uVar85;
  uint uVar86;
  uint uVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar84 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_17d8;
  undefined1 local_1780 [16];
  undefined1 (*local_1768) [16];
  ulong *local_1760;
  ulong local_1758;
  ulong local_1750;
  long local_1748;
  long local_1740;
  ulong local_1738;
  ulong local_1730;
  long local_1728;
  ulong local_1720;
  ulong local_1718;
  ulong local_1710;
  ulong local_1708;
  ulong local_1700;
  ulong local_16f8;
  RTCFilterFunctionNArguments local_16f0;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [16];
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined1 local_1620 [16];
  RTCHitN local_1610 [16];
  undefined1 local_1600 [16];
  undefined1 local_15f0 [16];
  undefined4 local_15e0;
  undefined4 uStack_15dc;
  undefined4 uStack_15d8;
  undefined4 uStack_15d4;
  undefined1 local_15d0 [16];
  undefined1 local_15c0 [16];
  undefined1 local_15b0 [16];
  uint local_15a0;
  uint uStack_159c;
  uint uStack_1598;
  uint uStack_1594;
  uint uStack_1590;
  uint uStack_158c;
  uint uStack_1588;
  uint uStack_1584;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined4 local_1440;
  undefined4 uStack_143c;
  undefined4 uStack_1438;
  undefined4 uStack_1434;
  undefined4 uStack_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1460._4_4_ = fVar1;
  local_1460._0_4_ = fVar1;
  local_1460._8_4_ = fVar1;
  local_1460._12_4_ = fVar1;
  local_1460._16_4_ = fVar1;
  local_1460._20_4_ = fVar1;
  local_1460._24_4_ = fVar1;
  local_1460._28_4_ = fVar1;
  auVar67 = ZEXT3264(local_1460);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1480._4_4_ = fVar2;
  local_1480._0_4_ = fVar2;
  local_1480._8_4_ = fVar2;
  local_1480._12_4_ = fVar2;
  local_1480._16_4_ = fVar2;
  local_1480._20_4_ = fVar2;
  local_1480._24_4_ = fVar2;
  local_1480._28_4_ = fVar2;
  auVar69 = ZEXT3264(local_1480);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14a0._4_4_ = fVar88;
  local_14a0._0_4_ = fVar88;
  local_14a0._8_4_ = fVar88;
  local_14a0._12_4_ = fVar88;
  local_14a0._16_4_ = fVar88;
  local_14a0._20_4_ = fVar88;
  local_14a0._24_4_ = fVar88;
  local_14a0._28_4_ = fVar88;
  auVar72 = ZEXT3264(local_14a0);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar88 = fVar88 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar51 = uVar43 ^ 0x20;
  uVar49 = uVar48 ^ 0x20;
  local_14c0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_14c0._8_4_ = -fVar1;
  local_14c0._12_4_ = -fVar1;
  local_14c0._16_4_ = -fVar1;
  local_14c0._20_4_ = -fVar1;
  local_14c0._24_4_ = -fVar1;
  local_14c0._28_4_ = -fVar1;
  auVar76 = ZEXT3264(local_14c0);
  local_14e0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_14e0._8_4_ = -fVar2;
  local_14e0._12_4_ = -fVar2;
  local_14e0._16_4_ = -fVar2;
  local_14e0._20_4_ = -fVar2;
  local_14e0._24_4_ = -fVar2;
  local_14e0._28_4_ = -fVar2;
  auVar82 = ZEXT3264(local_14e0);
  local_1440 = 0x80000000;
  uStack_143c = 0x80000000;
  uStack_1438 = 0x80000000;
  uStack_1434 = 0x80000000;
  uStack_1430 = 0x80000000;
  uStack_142c = 0x80000000;
  uStack_1428 = 0x80000000;
  uStack_1424 = 0x80000000;
  local_1500._0_8_ = CONCAT44(fVar88,fVar88) ^ 0x8000000080000000;
  local_1500._8_4_ = -fVar88;
  local_1500._12_4_ = -fVar88;
  local_1500._16_4_ = -fVar88;
  local_1500._20_4_ = -fVar88;
  local_1500._24_4_ = -fVar88;
  local_1500._28_4_ = -fVar88;
  auVar84 = ZEXT3264(local_1500);
  iVar39 = (tray->tnear).field_0.i[k];
  local_1520._4_4_ = iVar39;
  local_1520._0_4_ = iVar39;
  local_1520._8_4_ = iVar39;
  local_1520._12_4_ = iVar39;
  local_1520._16_4_ = iVar39;
  local_1520._20_4_ = iVar39;
  local_1520._24_4_ = iVar39;
  local_1520._28_4_ = iVar39;
  auVar94 = ZEXT3264(local_1520);
  iVar39 = (tray->tfar).field_0.i[k];
  local_1540._4_4_ = iVar39;
  local_1540._0_4_ = iVar39;
  local_1540._8_4_ = iVar39;
  local_1540._12_4_ = iVar39;
  local_1540._16_4_ = iVar39;
  local_1540._20_4_ = iVar39;
  local_1540._24_4_ = iVar39;
  local_1540._28_4_ = iVar39;
  auVar98 = ZEXT3264(local_1540);
  local_1560._16_16_ = mm_lookupmask_ps._240_16_;
  local_1560._0_16_ = mm_lookupmask_ps._0_16_;
  local_1768 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar61._8_4_ = 0x3f800000;
  auVar61._0_8_ = 0x3f8000003f800000;
  auVar61._12_4_ = 0x3f800000;
  auVar61._16_4_ = 0x3f800000;
  auVar61._20_4_ = 0x3f800000;
  auVar61._24_4_ = 0x3f800000;
  auVar61._28_4_ = 0x3f800000;
  auVar81._8_4_ = 0xbf800000;
  auVar81._0_8_ = 0xbf800000bf800000;
  auVar81._12_4_ = 0xbf800000;
  auVar81._16_4_ = 0xbf800000;
  auVar81._20_4_ = 0xbf800000;
  auVar81._24_4_ = 0xbf800000;
  auVar81._28_4_ = 0xbf800000;
  local_1580 = vblendvps_avx(auVar61,auVar81,local_1560);
  puVar35 = local_11f8;
  local_1758 = uVar48;
  local_1750 = uVar43;
LAB_016809cc:
  do {
    local_1760 = puVar35;
    if (local_1760 == &local_1200) {
LAB_0168162c:
      return local_1760 != &local_1200;
    }
    local_17d8 = local_1760 + -1;
    uVar50 = local_1760[-1];
    while ((uVar50 & 8) == 0) {
      uVar36 = uVar50 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar55._4_4_ = uVar3;
      auVar55._0_4_ = uVar3;
      auVar55._8_4_ = uVar3;
      auVar55._12_4_ = uVar3;
      auVar55._16_4_ = uVar3;
      auVar55._20_4_ = uVar3;
      auVar55._24_4_ = uVar3;
      auVar55._28_4_ = uVar3;
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar43),auVar55,
                                *(undefined1 (*) [32])(uVar36 + 0x40 + uVar43));
      auVar54 = vfmadd213ps_fma(ZEXT1632(auVar54),auVar67._0_32_,auVar76._0_32_);
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar48),auVar55,
                                *(undefined1 (*) [32])(uVar36 + 0x40 + uVar48));
      auVar52 = vfmadd213ps_fma(ZEXT1632(auVar52),auVar69._0_32_,auVar82._0_32_);
      auVar81 = vpmaxsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar52));
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar42),auVar55,
                                *(undefined1 (*) [32])(uVar36 + 0x40 + uVar42));
      auVar54 = vfmadd213ps_fma(ZEXT1632(auVar54),auVar72._0_32_,auVar84._0_32_);
      auVar61 = vpmaxsd_avx2(ZEXT1632(auVar54),auVar94._0_32_);
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar51),auVar55,
                                *(undefined1 (*) [32])(uVar36 + 0x40 + uVar51));
      auVar81 = vpmaxsd_avx2(auVar81,auVar61);
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar49),auVar55,
                                *(undefined1 (*) [32])(uVar36 + 0x40 + uVar49));
      auVar54 = vfmadd213ps_fma(ZEXT1632(auVar54),auVar67._0_32_,auVar76._0_32_);
      auVar52 = vfmadd213ps_fma(ZEXT1632(auVar52),auVar69._0_32_,auVar82._0_32_);
      auVar61 = vpminsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar52));
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + (uVar42 ^ 0x20)),auVar55,
                                *(undefined1 (*) [32])(uVar36 + 0x40 + (uVar42 ^ 0x20)));
      auVar54 = vfmadd213ps_fma(ZEXT1632(auVar54),auVar72._0_32_,auVar84._0_32_);
      auVar24 = vpminsd_avx2(ZEXT1632(auVar54),auVar98._0_32_);
      auVar61 = vpminsd_avx2(auVar61,auVar24);
      auVar81 = vcmpps_avx(auVar81,auVar61,2);
      if (((uint)uVar50 & 7) == 6) {
        auVar61 = vcmpps_avx(*(undefined1 (*) [32])(uVar36 + 0x1c0),auVar55,2);
        auVar24 = vcmpps_avx(auVar55,*(undefined1 (*) [32])(uVar36 + 0x1e0),1);
        auVar61 = vandps_avx(auVar61,auVar24);
        auVar81 = vandps_avx(auVar61,auVar81);
        auVar54 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
      }
      else {
        auVar54 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
      }
      auVar52 = vpsllw_avx(auVar54,0xf);
      auVar54 = vpacksswb_avx(auVar52,auVar52);
      bVar23 = SUB161(auVar54 >> 7,0) & 1 | (SUB161(auVar54 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar54 >> 0x17,0) & 1) << 2 | (SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar54 >> 0x27,0) & 1) << 4 | (SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar54 >> 0x37,0) & 1) << 6 | SUB161(auVar54 >> 0x3f,0) << 7;
      puVar35 = local_17d8;
      if ((((((((auVar52 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar52 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar52 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar52 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar52[0xf])
      goto LAB_016809cc;
      lVar25 = 0;
      for (uVar50 = (ulong)bVar23; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar50 = *(ulong *)(uVar36 + lVar25 * 8);
      uVar38 = bVar23 - 1 & (uint)bVar23;
      uVar40 = (ulong)uVar38;
      if (uVar38 != 0) {
        do {
          *local_17d8 = uVar50;
          local_17d8 = local_17d8 + 1;
          lVar25 = 0;
          for (uVar50 = uVar40; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar40 = uVar40 - 1 & uVar40;
          uVar50 = *(ulong *)(uVar36 + lVar25 * 8);
        } while (uVar40 != 0);
      }
    }
    local_1748 = (ulong)((uint)uVar50 & 0xf) - 8;
    uVar50 = uVar50 & 0xfffffffffffffff0;
    for (local_1740 = 0; puVar35 = local_17d8, local_1740 != local_1748; local_1740 = local_1740 + 1
        ) {
      lVar37 = local_1740 * 0x60;
      pSVar11 = context->scene;
      pRVar12 = (pSVar11->geometries).items;
      pGVar13 = pRVar12[*(uint *)(uVar50 + 0x40 + lVar37)].ptr;
      fVar1 = (pGVar13->time_range).lower;
      fVar1 = pGVar13->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar13->time_range).upper - fVar1));
      auVar54 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar54 = vminss_avx(auVar54,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
      auVar57 = vmaxss_avx(ZEXT816(0) << 0x20,auVar54);
      iVar39 = (int)auVar57._0_4_;
      lVar46 = (long)iVar39 * 0x38;
      lVar25 = *(long *)(*(long *)&pGVar13[2].numPrimitives + lVar46);
      local_1710 = (ulong)*(uint *)(uVar50 + 4 + lVar37);
      auVar54 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar50 + lVar37) * 4);
      uVar36 = (ulong)*(uint *)(uVar50 + 0x10 + lVar37);
      auVar52 = *(undefined1 (*) [16])(lVar25 + uVar36 * 4);
      uVar40 = (ulong)*(uint *)(uVar50 + 0x20 + lVar37);
      auVar60 = *(undefined1 (*) [16])(lVar25 + uVar40 * 4);
      uVar44 = (ulong)*(uint *)(uVar50 + 0x30 + lVar37);
      auVar4 = *(undefined1 (*) [16])(lVar25 + uVar44 * 4);
      local_1728 = *(long *)&pRVar12[*(uint *)(uVar50 + 0x44 + lVar37)].ptr[2].numPrimitives;
      lVar25 = *(long *)(local_1728 + lVar46);
      auVar5 = *(undefined1 (*) [16])(lVar25 + local_1710 * 4);
      local_1700 = (ulong)*(uint *)(uVar50 + 0x14 + lVar37);
      auVar53 = *(undefined1 (*) [16])(lVar25 + local_1700 * 4);
      local_16f8 = (ulong)*(uint *)(uVar50 + 0x24 + lVar37);
      auVar6 = *(undefined1 (*) [16])(lVar25 + local_16f8 * 4);
      uVar45 = (ulong)*(uint *)(uVar50 + 0x34 + lVar37);
      auVar7 = *(undefined1 (*) [16])(lVar25 + uVar45 * 4);
      lVar25 = *(long *)&pRVar12[*(uint *)(uVar50 + 0x48 + lVar37)].ptr[2].numPrimitives;
      lVar14 = *(long *)(lVar25 + lVar46);
      uVar48 = (ulong)*(uint *)(uVar50 + 8 + lVar37);
      auVar8 = *(undefined1 (*) [16])(lVar14 + uVar48 * 4);
      local_1720 = (ulong)*(uint *)(uVar50 + 0x18 + lVar37);
      auVar9 = *(undefined1 (*) [16])(lVar14 + local_1720 * 4);
      local_1718 = (ulong)*(uint *)(uVar50 + 0x28 + lVar37);
      auVar59 = *(undefined1 (*) [16])(lVar14 + local_1718 * 4);
      local_1708 = (ulong)*(uint *)(uVar50 + 0x38 + lVar37);
      auVar10 = *(undefined1 (*) [16])(lVar14 + local_1708 * 4);
      fVar1 = fVar1 - auVar57._0_4_;
      lVar14 = *(long *)&pRVar12[*(uint *)(uVar50 + 0x4c + lVar37)].ptr[2].numPrimitives;
      lVar46 = *(long *)(lVar14 + lVar46);
      uVar43 = (ulong)*(uint *)(uVar50 + 0xc + lVar37);
      auVar57 = *(undefined1 (*) [16])(lVar46 + uVar43 * 4);
      local_1738 = (ulong)*(uint *)(uVar50 + 0x1c + lVar37);
      auVar63 = *(undefined1 (*) [16])(lVar46 + local_1738 * 4);
      auVar68 = vunpcklps_avx(auVar54,auVar8);
      auVar8 = vunpckhps_avx(auVar54,auVar8);
      auVar95 = vunpcklps_avx(auVar5,auVar57);
      auVar5 = vunpckhps_avx(auVar5,auVar57);
      uVar47 = (ulong)*(uint *)(uVar50 + 0x2c + lVar37);
      auVar54 = *(undefined1 (*) [16])(lVar46 + uVar47 * 4);
      local_1630 = vunpcklps_avx(auVar8,auVar5);
      auVar8 = vunpcklps_avx(auVar68,auVar95);
      local_1650 = vunpckhps_avx(auVar68,auVar95);
      auVar57 = vunpcklps_avx(auVar52,auVar9);
      auVar5 = vunpckhps_avx(auVar52,auVar9);
      auVar9 = vunpcklps_avx(auVar53,auVar63);
      auVar53 = vunpckhps_avx(auVar53,auVar63);
      local_1730 = (ulong)*(uint *)(uVar50 + 0x3c + lVar37);
      auVar52 = *(undefined1 (*) [16])(lVar46 + local_1730 * 4);
      local_1620 = vunpcklps_avx(auVar5,auVar53);
      local_1660 = vunpcklps_avx(auVar57,auVar9);
      local_1640 = vunpckhps_avx(auVar57,auVar9);
      auVar53 = vunpcklps_avx(auVar60,auVar59);
      auVar60 = vunpckhps_avx(auVar60,auVar59);
      auVar9 = vunpcklps_avx(auVar6,auVar54);
      auVar5 = vunpckhps_avx(auVar6,auVar54);
      lVar41 = (long)(iVar39 + 1) * 0x38;
      lVar46 = *(long *)(*(long *)&pGVar13[2].numPrimitives + lVar41);
      auVar54 = *(undefined1 (*) [16])(lVar46 + (ulong)*(uint *)(uVar50 + lVar37) * 4);
      auVar6 = vunpcklps_avx(auVar60,auVar5);
      local_1690 = vunpcklps_avx(auVar53,auVar9);
      local_1670 = vunpckhps_avx(auVar53,auVar9);
      auVar5 = vunpcklps_avx(auVar4,auVar10);
      auVar60 = vunpckhps_avx(auVar4,auVar10);
      auVar53 = vunpcklps_avx(auVar7,auVar52);
      auVar4 = vunpckhps_avx(auVar7,auVar52);
      lVar25 = *(long *)(lVar25 + lVar41);
      auVar52 = *(undefined1 (*) [16])(lVar25 + uVar48 * 4);
      auVar7 = vunpcklps_avx(auVar60,auVar4);
      local_16a0 = vunpcklps_avx(auVar5,auVar53);
      local_1680 = vunpckhps_avx(auVar5,auVar53);
      lVar15 = *(long *)(local_1728 + lVar41);
      auVar4 = vunpcklps_avx(auVar54,auVar52);
      auVar60 = vunpckhps_avx(auVar54,auVar52);
      auVar54 = *(undefined1 (*) [16])(lVar15 + local_1710 * 4);
      lVar14 = *(long *)(lVar14 + lVar41);
      auVar52 = *(undefined1 (*) [16])(lVar14 + uVar43 * 4);
      auVar5 = vunpcklps_avx(auVar54,auVar52);
      auVar54 = vunpckhps_avx(auVar54,auVar52);
      auVar9 = vunpcklps_avx(auVar60,auVar54);
      auVar59 = vunpcklps_avx(auVar4,auVar5);
      auVar60 = vunpckhps_avx(auVar4,auVar5);
      auVar54 = *(undefined1 (*) [16])(lVar46 + uVar36 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar25 + local_1720 * 4);
      auVar5 = vunpcklps_avx(auVar54,auVar52);
      auVar4 = vunpckhps_avx(auVar54,auVar52);
      auVar54 = *(undefined1 (*) [16])(lVar15 + local_1700 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar14 + local_1738 * 4);
      auVar53 = vunpcklps_avx(auVar54,auVar52);
      auVar54 = vunpckhps_avx(auVar54,auVar52);
      auVar10 = vunpcklps_avx(auVar4,auVar54);
      auVar57 = vunpcklps_avx(auVar5,auVar53);
      auVar4 = vunpckhps_avx(auVar5,auVar53);
      auVar54 = *(undefined1 (*) [16])(lVar46 + uVar40 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar25 + local_1718 * 4);
      auVar53 = vunpcklps_avx(auVar54,auVar52);
      auVar5 = vunpckhps_avx(auVar54,auVar52);
      auVar54 = *(undefined1 (*) [16])(lVar15 + local_16f8 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar14 + uVar47 * 4);
      auVar63 = vunpcklps_avx(auVar54,auVar52);
      auVar54 = vunpckhps_avx(auVar54,auVar52);
      auVar68 = vunpcklps_avx(auVar5,auVar54);
      auVar95 = vunpcklps_avx(auVar53,auVar63);
      auVar5 = vunpckhps_avx(auVar53,auVar63);
      auVar54 = *(undefined1 (*) [16])(lVar46 + uVar44 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar25 + local_1708 * 4);
      auVar63 = vunpcklps_avx(auVar54,auVar52);
      auVar53 = vunpckhps_avx(auVar54,auVar52);
      auVar54 = *(undefined1 (*) [16])(lVar15 + uVar45 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar14 + local_1730 * 4);
      auVar65 = vunpcklps_avx(auVar54,auVar52);
      auVar54 = vunpckhps_avx(auVar54,auVar52);
      auVar52 = vunpcklps_avx(auVar53,auVar54);
      auVar53 = vunpcklps_avx(auVar63,auVar65);
      auVar54 = vunpckhps_avx(auVar63,auVar65);
      fVar2 = 1.0 - fVar1;
      auVar102._4_4_ = fVar2;
      auVar102._0_4_ = fVar2;
      auVar102._8_4_ = fVar2;
      auVar102._12_4_ = fVar2;
      auVar63._0_4_ = fVar1 * auVar59._0_4_;
      auVar63._4_4_ = fVar1 * auVar59._4_4_;
      auVar63._8_4_ = fVar1 * auVar59._8_4_;
      auVar63._12_4_ = fVar1 * auVar59._12_4_;
      auVar8 = vfmadd231ps_fma(auVar63,auVar102,auVar8);
      auVar70._0_4_ = fVar1 * auVar60._0_4_;
      auVar70._4_4_ = fVar1 * auVar60._4_4_;
      auVar70._8_4_ = fVar1 * auVar60._8_4_;
      auVar70._12_4_ = fVar1 * auVar60._12_4_;
      auVar60 = vfmadd231ps_fma(auVar70,auVar102,local_1650);
      auVar65._0_4_ = auVar9._0_4_ * fVar1;
      auVar65._4_4_ = auVar9._4_4_ * fVar1;
      auVar65._8_4_ = auVar9._8_4_ * fVar1;
      auVar65._12_4_ = auVar9._12_4_ * fVar1;
      auVar9 = vfmadd231ps_fma(auVar65,auVar102,local_1630);
      auVar59._0_4_ = fVar1 * auVar57._0_4_;
      auVar59._4_4_ = fVar1 * auVar57._4_4_;
      auVar59._8_4_ = fVar1 * auVar57._8_4_;
      auVar59._12_4_ = fVar1 * auVar57._12_4_;
      auVar59 = vfmadd231ps_fma(auVar59,auVar102,local_1660);
      auVar57._0_4_ = fVar1 * auVar4._0_4_;
      auVar57._4_4_ = fVar1 * auVar4._4_4_;
      auVar57._8_4_ = fVar1 * auVar4._8_4_;
      auVar57._12_4_ = fVar1 * auVar4._12_4_;
      auVar4 = vfmadd231ps_fma(auVar57,auVar102,local_1640);
      auVar74._0_4_ = auVar10._0_4_ * fVar1;
      auVar74._4_4_ = auVar10._4_4_ * fVar1;
      auVar74._8_4_ = auVar10._8_4_ * fVar1;
      auVar74._12_4_ = auVar10._12_4_ * fVar1;
      auVar10 = vfmadd231ps_fma(auVar74,auVar102,local_1620);
      auVar83._0_4_ = auVar95._0_4_ * fVar1;
      auVar83._4_4_ = auVar95._4_4_ * fVar1;
      auVar83._8_4_ = auVar95._8_4_ * fVar1;
      auVar83._12_4_ = auVar95._12_4_ * fVar1;
      auVar57 = vfmadd231ps_fma(auVar83,auVar102,local_1690);
      auVar95._0_4_ = auVar5._0_4_ * fVar1;
      auVar95._4_4_ = auVar5._4_4_ * fVar1;
      auVar95._8_4_ = auVar5._8_4_ * fVar1;
      auVar95._12_4_ = auVar5._12_4_ * fVar1;
      auVar5 = vfmadd231ps_fma(auVar95,auVar102,local_1670);
      auVar99._0_4_ = auVar68._0_4_ * fVar1;
      auVar99._4_4_ = auVar68._4_4_ * fVar1;
      auVar99._8_4_ = auVar68._8_4_ * fVar1;
      auVar99._12_4_ = auVar68._12_4_ * fVar1;
      auVar6 = vfmadd231ps_fma(auVar99,auVar102,auVar6);
      auVar68._0_4_ = fVar1 * auVar53._0_4_;
      auVar68._4_4_ = fVar1 * auVar53._4_4_;
      auVar68._8_4_ = fVar1 * auVar53._8_4_;
      auVar68._12_4_ = fVar1 * auVar53._12_4_;
      auVar105._0_4_ = auVar54._0_4_ * fVar1;
      auVar105._4_4_ = auVar54._4_4_ * fVar1;
      auVar105._8_4_ = auVar54._8_4_ * fVar1;
      auVar105._12_4_ = auVar54._12_4_ * fVar1;
      auVar53._0_4_ = auVar52._0_4_ * fVar1;
      auVar53._4_4_ = auVar52._4_4_ * fVar1;
      auVar53._8_4_ = auVar52._8_4_ * fVar1;
      auVar53._12_4_ = auVar52._12_4_ * fVar1;
      lVar25 = uVar50 + 0x40 + lVar37;
      local_1400 = *(undefined8 *)(lVar25 + 0x10);
      uStack_13f8 = *(undefined8 *)(lVar25 + 0x18);
      auVar54 = vfmadd231ps_fma(auVar68,auVar102,local_16a0);
      uStack_13f0 = local_1400;
      uStack_13e8 = uStack_13f8;
      lVar37 = uVar50 + 0x50 + lVar37;
      local_1420 = *(undefined8 *)(lVar37 + 0x10);
      uStack_1418 = *(undefined8 *)(lVar37 + 0x18);
      auVar52 = vfmadd231ps_fma(auVar105,auVar102,local_1680);
      auVar53 = vfmadd231ps_fma(auVar53,auVar102,auVar7);
      uStack_1410 = local_1420;
      uStack_1408 = uStack_1418;
      auVar64._16_16_ = auVar57;
      auVar64._0_16_ = auVar8;
      auVar71._16_16_ = auVar5;
      auVar71._0_16_ = auVar60;
      auVar80._16_16_ = auVar6;
      auVar80._0_16_ = auVar9;
      auVar62._16_16_ = auVar59;
      auVar62._0_16_ = auVar59;
      auVar58._16_16_ = auVar4;
      auVar58._0_16_ = auVar4;
      auVar66._16_16_ = auVar10;
      auVar66._0_16_ = auVar10;
      auVar91._16_16_ = auVar54;
      auVar91._0_16_ = auVar54;
      auVar96._16_16_ = auVar52;
      auVar96._0_16_ = auVar52;
      auVar56._16_16_ = auVar53;
      auVar56._0_16_ = auVar53;
      auVar61 = vsubps_avx(auVar64,auVar62);
      auVar81 = vsubps_avx(auVar71,auVar58);
      auVar24 = vsubps_avx(auVar80,auVar66);
      auVar55 = vsubps_avx(auVar91,auVar64);
      auVar19 = vsubps_avx(auVar96,auVar71);
      auVar20 = vsubps_avx(auVar56,auVar80);
      auVar21._4_4_ = auVar20._4_4_ * auVar81._4_4_;
      auVar21._0_4_ = auVar20._0_4_ * auVar81._0_4_;
      auVar21._8_4_ = auVar20._8_4_ * auVar81._8_4_;
      auVar21._12_4_ = auVar20._12_4_ * auVar81._12_4_;
      auVar21._16_4_ = auVar20._16_4_ * auVar81._16_4_;
      auVar21._20_4_ = auVar20._20_4_ * auVar81._20_4_;
      auVar21._24_4_ = auVar20._24_4_ * auVar81._24_4_;
      auVar21._28_4_ = auVar53._12_4_;
      auVar5 = vfmsub231ps_fma(auVar21,auVar19,auVar24);
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar100._4_4_ = uVar3;
      auVar100._0_4_ = uVar3;
      auVar100._8_4_ = uVar3;
      auVar100._12_4_ = uVar3;
      auVar100._16_4_ = uVar3;
      auVar100._20_4_ = uVar3;
      auVar100._24_4_ = uVar3;
      auVar100._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar103._4_4_ = uVar3;
      auVar103._0_4_ = uVar3;
      auVar103._8_4_ = uVar3;
      auVar103._12_4_ = uVar3;
      auVar103._16_4_ = uVar3;
      auVar103._20_4_ = uVar3;
      auVar103._24_4_ = uVar3;
      auVar103._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar106._4_4_ = uVar3;
      auVar106._0_4_ = uVar3;
      auVar106._8_4_ = uVar3;
      auVar106._12_4_ = uVar3;
      auVar106._16_4_ = uVar3;
      auVar106._20_4_ = uVar3;
      auVar106._24_4_ = uVar3;
      auVar106._28_4_ = uVar3;
      fVar1 = *(float *)(ray + k * 4 + 0x40);
      auVar92._4_4_ = fVar1;
      auVar92._0_4_ = fVar1;
      auVar92._8_4_ = fVar1;
      auVar92._12_4_ = fVar1;
      auVar92._16_4_ = fVar1;
      auVar92._20_4_ = fVar1;
      auVar92._24_4_ = fVar1;
      auVar92._28_4_ = fVar1;
      auVar22._4_4_ = auVar24._4_4_ * auVar55._4_4_;
      auVar22._0_4_ = auVar24._0_4_ * auVar55._0_4_;
      auVar22._8_4_ = auVar24._8_4_ * auVar55._8_4_;
      auVar22._12_4_ = auVar24._12_4_ * auVar55._12_4_;
      auVar22._16_4_ = auVar24._16_4_ * auVar55._16_4_;
      auVar22._20_4_ = auVar24._20_4_ * auVar55._20_4_;
      auVar22._24_4_ = auVar24._24_4_ * auVar55._24_4_;
      auVar22._28_4_ = auVar4._12_4_;
      auVar21 = vsubps_avx(auVar64,auVar100);
      fVar2 = *(float *)(ray + k * 4 + 0x50);
      auVar101._4_4_ = fVar2;
      auVar101._0_4_ = fVar2;
      auVar101._8_4_ = fVar2;
      auVar101._12_4_ = fVar2;
      auVar101._16_4_ = fVar2;
      auVar101._20_4_ = fVar2;
      auVar101._24_4_ = fVar2;
      auVar101._28_4_ = fVar2;
      auVar4 = vfmsub231ps_fma(auVar22,auVar20,auVar61);
      auVar22 = vsubps_avx(auVar71,auVar103);
      fVar88 = *(float *)(ray + k * 4 + 0x60);
      auVar104._4_4_ = fVar88;
      auVar104._0_4_ = fVar88;
      auVar104._8_4_ = fVar88;
      auVar104._12_4_ = fVar88;
      auVar104._16_4_ = fVar88;
      auVar104._20_4_ = fVar88;
      auVar104._24_4_ = fVar88;
      auVar104._28_4_ = fVar88;
      auVar56 = vsubps_avx(auVar80,auVar106);
      auVar26._4_4_ = fVar1 * auVar22._4_4_;
      auVar26._0_4_ = fVar1 * auVar22._0_4_;
      auVar26._8_4_ = fVar1 * auVar22._8_4_;
      auVar26._12_4_ = fVar1 * auVar22._12_4_;
      auVar26._16_4_ = fVar1 * auVar22._16_4_;
      auVar26._20_4_ = fVar1 * auVar22._20_4_;
      auVar26._24_4_ = fVar1 * auVar22._24_4_;
      auVar26._28_4_ = uVar3;
      auVar54 = vfmsub231ps_fma(auVar26,auVar21,auVar101);
      auVar27._4_4_ = auVar20._4_4_ * auVar54._4_4_;
      auVar27._0_4_ = auVar20._0_4_ * auVar54._0_4_;
      auVar27._8_4_ = auVar20._8_4_ * auVar54._8_4_;
      auVar27._12_4_ = auVar20._12_4_ * auVar54._12_4_;
      auVar27._16_4_ = auVar20._16_4_ * 0.0;
      auVar27._20_4_ = auVar20._20_4_ * 0.0;
      auVar27._24_4_ = auVar20._24_4_ * 0.0;
      auVar27._28_4_ = auVar20._28_4_;
      auVar107._0_4_ = auVar24._0_4_ * auVar54._0_4_;
      auVar107._4_4_ = auVar24._4_4_ * auVar54._4_4_;
      auVar107._8_4_ = auVar24._8_4_ * auVar54._8_4_;
      auVar107._12_4_ = auVar24._12_4_ * auVar54._12_4_;
      auVar107._16_4_ = auVar24._16_4_ * 0.0;
      auVar107._20_4_ = auVar24._20_4_ * 0.0;
      auVar107._24_4_ = auVar24._24_4_ * 0.0;
      auVar107._28_4_ = 0;
      auVar20._4_4_ = fVar88 * auVar21._4_4_;
      auVar20._0_4_ = fVar88 * auVar21._0_4_;
      auVar20._8_4_ = fVar88 * auVar21._8_4_;
      auVar20._12_4_ = fVar88 * auVar21._12_4_;
      auVar20._16_4_ = fVar88 * auVar21._16_4_;
      auVar20._20_4_ = fVar88 * auVar21._20_4_;
      auVar20._24_4_ = fVar88 * auVar21._24_4_;
      auVar20._28_4_ = auVar24._28_4_;
      auVar52 = vfmsub231ps_fma(auVar20,auVar56,auVar92);
      auVar54 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar52),auVar19);
      auVar52 = vfmadd231ps_fma(auVar107,auVar81,ZEXT1632(auVar52));
      auVar24._4_4_ = auVar61._4_4_ * auVar19._4_4_;
      auVar24._0_4_ = auVar61._0_4_ * auVar19._0_4_;
      auVar24._8_4_ = auVar61._8_4_ * auVar19._8_4_;
      auVar24._12_4_ = auVar61._12_4_ * auVar19._12_4_;
      auVar24._16_4_ = auVar61._16_4_ * auVar19._16_4_;
      auVar24._20_4_ = auVar61._20_4_ * auVar19._20_4_;
      auVar24._24_4_ = auVar61._24_4_ * auVar19._24_4_;
      auVar24._28_4_ = auVar19._28_4_;
      auVar53 = vfmsub231ps_fma(auVar24,auVar55,auVar81);
      auVar19._4_4_ = fVar2 * auVar56._4_4_;
      auVar19._0_4_ = fVar2 * auVar56._0_4_;
      auVar19._8_4_ = fVar2 * auVar56._8_4_;
      auVar19._12_4_ = fVar2 * auVar56._12_4_;
      auVar19._16_4_ = fVar2 * auVar56._16_4_;
      auVar19._20_4_ = fVar2 * auVar56._20_4_;
      auVar19._24_4_ = fVar2 * auVar56._24_4_;
      auVar19._28_4_ = auVar81._28_4_;
      auVar6 = vfmsub231ps_fma(auVar19,auVar22,auVar104);
      fVar1 = auVar53._0_4_;
      fVar2 = auVar53._4_4_;
      auVar28._4_4_ = fVar88 * fVar2;
      auVar28._0_4_ = fVar88 * fVar1;
      fVar17 = auVar53._8_4_;
      auVar28._8_4_ = fVar88 * fVar17;
      fVar18 = auVar53._12_4_;
      auVar28._12_4_ = fVar88 * fVar18;
      auVar28._16_4_ = fVar88 * 0.0;
      auVar28._20_4_ = fVar88 * 0.0;
      auVar28._24_4_ = fVar88 * 0.0;
      auVar28._28_4_ = fVar88;
      auVar60 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar4),auVar101);
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),ZEXT1632(auVar5),auVar92);
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar6),auVar55);
      auVar34._4_4_ = uStack_143c;
      auVar34._0_4_ = local_1440;
      auVar34._8_4_ = uStack_1438;
      auVar34._12_4_ = uStack_1434;
      auVar34._16_4_ = uStack_1430;
      auVar34._20_4_ = uStack_142c;
      auVar34._24_4_ = uStack_1428;
      auVar34._28_4_ = uStack_1424;
      auVar81 = vandps_avx(ZEXT1632(auVar60),auVar34);
      uVar38 = auVar81._0_4_;
      local_13e0._0_4_ = (float)(uVar38 ^ auVar54._0_4_);
      uVar85 = auVar81._4_4_;
      local_13e0._4_4_ = (float)(uVar85 ^ auVar54._4_4_);
      uVar86 = auVar81._8_4_;
      local_13e0._8_4_ = (float)(uVar86 ^ auVar54._8_4_);
      uVar87 = auVar81._12_4_;
      local_13e0._12_4_ = (float)(uVar87 ^ auVar54._12_4_);
      fVar88 = auVar81._16_4_;
      local_13e0._16_4_ = fVar88;
      fVar89 = auVar81._20_4_;
      local_13e0._20_4_ = fVar89;
      fVar90 = auVar81._24_4_;
      local_13e0._24_4_ = fVar90;
      fStack_1284 = auVar81._28_4_;
      local_13e0._28_4_ = fStack_1284;
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar61,ZEXT1632(auVar6));
      local_13c0._0_4_ = (float)(uVar38 ^ auVar54._0_4_);
      local_13c0._4_4_ = (float)(uVar85 ^ auVar54._4_4_);
      local_13c0._8_4_ = (float)(uVar86 ^ auVar54._8_4_);
      local_13c0._12_4_ = (float)(uVar87 ^ auVar54._12_4_);
      local_13c0._16_4_ = fVar88;
      local_13c0._20_4_ = fVar89;
      local_13c0._24_4_ = fVar90;
      local_13c0._28_4_ = fStack_1284;
      auVar81 = vcmpps_avx(local_13e0,ZEXT832(0) << 0x20,5);
      auVar61 = vcmpps_avx(local_13c0,ZEXT832(0) << 0x20,5);
      auVar81 = vandps_avx(auVar61,auVar81);
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75._16_4_ = 0x7fffffff;
      auVar75._20_4_ = 0x7fffffff;
      auVar75._24_4_ = 0x7fffffff;
      auVar75._28_4_ = 0x7fffffff;
      local_1380 = vandps_avx(ZEXT1632(auVar60),auVar75);
      auVar61 = vcmpps_avx(ZEXT1632(auVar60),ZEXT832(0) << 0x20,4);
      auVar81 = vandps_avx(auVar81,auVar61);
      auVar97._0_4_ = local_13e0._0_4_ + local_13c0._0_4_;
      auVar97._4_4_ = local_13e0._4_4_ + local_13c0._4_4_;
      auVar97._8_4_ = local_13e0._8_4_ + local_13c0._8_4_;
      auVar97._12_4_ = local_13e0._12_4_ + local_13c0._12_4_;
      auVar97._16_4_ = fVar88 + fVar88;
      auVar97._20_4_ = fVar89 + fVar89;
      auVar97._24_4_ = fVar90 + fVar90;
      auVar97._28_4_ = fStack_1284 + fStack_1284;
      auVar61 = vcmpps_avx(auVar97,local_1380,2);
      auVar24 = auVar61 & auVar81;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar81 = vandps_avx(auVar81,auVar61);
        auVar54 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
        auVar29._4_4_ = auVar56._4_4_ * fVar2;
        auVar29._0_4_ = auVar56._0_4_ * fVar1;
        auVar29._8_4_ = auVar56._8_4_ * fVar17;
        auVar29._12_4_ = auVar56._12_4_ * fVar18;
        auVar29._16_4_ = auVar56._16_4_ * 0.0;
        auVar29._20_4_ = auVar56._20_4_ * 0.0;
        auVar29._24_4_ = auVar56._24_4_ * 0.0;
        auVar29._28_4_ = auVar56._28_4_;
        auVar52 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar4),auVar29);
        auVar52 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar5),ZEXT1632(auVar52));
        local_13a0._0_4_ = (float)(uVar38 ^ auVar52._0_4_);
        local_13a0._4_4_ = (float)(uVar85 ^ auVar52._4_4_);
        local_13a0._8_4_ = (float)(uVar86 ^ auVar52._8_4_);
        local_13a0._12_4_ = (float)(uVar87 ^ auVar52._12_4_);
        local_13a0._16_4_ = fVar88;
        local_13a0._20_4_ = fVar89;
        local_13a0._24_4_ = fVar90;
        local_13a0._28_4_ = fStack_1284;
        fVar73 = *(float *)(ray + k * 4 + 0x30);
        auVar30._4_4_ = local_1380._4_4_ * fVar73;
        auVar30._0_4_ = local_1380._0_4_ * fVar73;
        auVar30._8_4_ = local_1380._8_4_ * fVar73;
        auVar30._12_4_ = local_1380._12_4_ * fVar73;
        auVar30._16_4_ = local_1380._16_4_ * fVar73;
        auVar30._20_4_ = local_1380._20_4_ * fVar73;
        auVar30._24_4_ = local_1380._24_4_ * fVar73;
        auVar30._28_4_ = fVar73;
        auVar81 = vcmpps_avx(auVar30,local_13a0,1);
        fVar73 = *(float *)(ray + k * 4 + 0x80);
        auVar67 = ZEXT3264(CONCAT428(fVar73,CONCAT424(fVar73,CONCAT420(fVar73,CONCAT416(fVar73,
                                                  CONCAT412(fVar73,CONCAT48(fVar73,CONCAT44(fVar73,
                                                  fVar73))))))));
        auVar31._4_4_ = fVar73 * local_1380._4_4_;
        auVar31._0_4_ = fVar73 * local_1380._0_4_;
        auVar31._8_4_ = fVar73 * local_1380._8_4_;
        auVar31._12_4_ = fVar73 * local_1380._12_4_;
        auVar31._16_4_ = fVar73 * local_1380._16_4_;
        auVar31._20_4_ = fVar73 * local_1380._20_4_;
        auVar31._24_4_ = fVar73 * local_1380._24_4_;
        auVar31._28_4_ = auVar56._28_4_;
        auVar61 = vcmpps_avx(local_13a0,auVar31,2);
        auVar81 = vandps_avx(auVar61,auVar81);
        auVar52 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
        auVar54 = vpand_avx(auVar54,auVar52);
        auVar81 = vpmovzxwd_avx2(auVar54);
        auVar81 = vpslld_avx2(auVar81,0x1f);
        if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar81 >> 0x7f,0) != '\0') ||
              (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar81 >> 0xbf,0) != '\0') ||
            (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar81[0x1f] < '\0') {
          local_1300 = vpsrad_avx2(auVar81,0x1f);
          local_1360 = ZEXT1632(auVar5);
          local_1340 = ZEXT1632(auVar4);
          local_1320 = ZEXT1632(auVar53);
          auVar81 = vrcpps_avx(local_1380);
          local_1220 = local_1560;
          auVar93._8_4_ = 0x3f800000;
          auVar93._0_8_ = 0x3f8000003f800000;
          auVar93._12_4_ = 0x3f800000;
          auVar93._16_4_ = 0x3f800000;
          auVar93._20_4_ = 0x3f800000;
          auVar93._24_4_ = 0x3f800000;
          auVar93._28_4_ = 0x3f800000;
          auVar52 = vfnmadd213ps_fma(local_1380,auVar81,auVar93);
          auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar81,auVar81);
          fVar73 = auVar52._0_4_;
          fVar77 = auVar52._4_4_;
          fVar78 = auVar52._8_4_;
          fVar79 = auVar52._12_4_;
          local_12a0[0] = fVar73 * local_13a0._0_4_;
          local_12a0[1] = fVar77 * local_13a0._4_4_;
          local_12a0[2] = fVar78 * local_13a0._8_4_;
          local_12a0[3] = fVar79 * local_13a0._12_4_;
          fStack_1290 = fVar88 * 0.0;
          fStack_128c = fVar89 * 0.0;
          fStack_1288 = fVar90 * 0.0;
          auVar32._4_4_ = fVar77 * local_13e0._4_4_;
          auVar32._0_4_ = fVar73 * local_13e0._0_4_;
          auVar32._8_4_ = fVar78 * local_13e0._8_4_;
          auVar32._12_4_ = fVar79 * local_13e0._12_4_;
          auVar32._16_4_ = fVar88 * 0.0;
          auVar32._20_4_ = fVar89 * 0.0;
          auVar32._24_4_ = fVar90 * 0.0;
          auVar32._28_4_ = fStack_1284;
          auVar81 = vminps_avx(auVar32,auVar93);
          auVar33._4_4_ = fVar77 * local_13c0._4_4_;
          auVar33._0_4_ = fVar73 * local_13c0._0_4_;
          auVar33._8_4_ = fVar78 * local_13c0._8_4_;
          auVar33._12_4_ = fVar79 * local_13c0._12_4_;
          auVar33._16_4_ = fVar88 * 0.0;
          auVar33._20_4_ = fVar89 * 0.0;
          auVar33._24_4_ = fVar90 * 0.0;
          auVar33._28_4_ = fStack_1284;
          auVar61 = vminps_avx(auVar33,auVar93);
          auVar24 = vsubps_avx(auVar93,auVar81);
          auVar55 = vsubps_avx(auVar93,auVar61);
          local_12c0 = vblendvps_avx(auVar61,auVar24,local_1560);
          local_12e0 = vblendvps_avx(auVar81,auVar55,local_1560);
          fVar88 = local_1580._0_4_;
          local_1280._0_4_ = auVar5._0_4_ * fVar88;
          fVar89 = local_1580._4_4_;
          local_1280._4_4_ = auVar5._4_4_ * fVar89;
          fVar90 = local_1580._8_4_;
          local_1280._8_4_ = auVar5._8_4_ * fVar90;
          fVar73 = local_1580._12_4_;
          local_1280._12_4_ = auVar5._12_4_ * fVar73;
          fVar77 = local_1580._16_4_;
          local_1280._16_4_ = fVar77 * 0.0;
          fVar78 = local_1580._20_4_;
          local_1280._20_4_ = fVar78 * 0.0;
          fVar79 = local_1580._24_4_;
          local_1280._24_4_ = fVar79 * 0.0;
          local_1280._28_4_ = 0;
          local_1260._0_4_ = fVar88 * auVar4._0_4_;
          local_1260._4_4_ = fVar89 * auVar4._4_4_;
          local_1260._8_4_ = fVar90 * auVar4._8_4_;
          local_1260._12_4_ = fVar73 * auVar4._12_4_;
          local_1260._16_4_ = fVar77 * 0.0;
          local_1260._20_4_ = fVar78 * 0.0;
          local_1260._24_4_ = fVar79 * 0.0;
          local_1260._28_4_ = 0;
          local_1240._0_4_ = fVar88 * fVar1;
          local_1240._4_4_ = fVar89 * fVar2;
          local_1240._8_4_ = fVar90 * fVar17;
          local_1240._12_4_ = fVar73 * fVar18;
          local_1240._16_4_ = fVar77 * 0.0;
          local_1240._20_4_ = fVar78 * 0.0;
          local_1240._24_4_ = fVar79 * 0.0;
          local_1240._28_4_ = 0;
          auVar54 = vpsllw_avx(auVar54,0xf);
          auVar54 = vpacksswb_avx(auVar54,auVar54);
          uVar43 = (ulong)(byte)(SUB161(auVar54 >> 7,0) & 1 | (SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar54 >> 0x3f,0) << 7);
          do {
            uVar48 = 0;
            for (uVar36 = uVar43; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              uVar48 = uVar48 + 1;
            }
            uVar38 = *(uint *)((long)&local_1400 + uVar48 * 4);
            pGVar13 = (pSVar11->geometries).items[uVar38].ptr;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_16c0 = auVar67._0_32_;
                uVar36 = (ulong)(uint)((int)uVar48 * 4);
                local_15e0 = *(undefined4 *)(local_12e0 + uVar36);
                uVar3 = *(undefined4 *)(local_12c0 + uVar36);
                local_15d0._4_4_ = uVar3;
                local_15d0._0_4_ = uVar3;
                local_15d0._8_4_ = uVar3;
                local_15d0._12_4_ = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12a0 + uVar36);
                local_16f0.context = context->user;
                local_15b0._4_4_ = uVar38;
                local_15b0._0_4_ = uVar38;
                local_15b0._8_4_ = uVar38;
                local_15b0._12_4_ = uVar38;
                uVar3 = *(undefined4 *)((long)&local_1420 + uVar36);
                local_15c0._4_4_ = uVar3;
                local_15c0._0_4_ = uVar3;
                local_15c0._8_4_ = uVar3;
                local_15c0._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1280 + uVar36);
                local_1610._4_4_ = uVar3;
                local_1610._0_4_ = uVar3;
                local_1610._8_4_ = uVar3;
                local_1610._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1260 + uVar36);
                local_1600._4_4_ = uVar3;
                local_1600._0_4_ = uVar3;
                local_1600._8_4_ = uVar3;
                local_1600._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1240 + uVar36);
                local_15f0._4_4_ = uVar3;
                local_15f0._0_4_ = uVar3;
                local_15f0._8_4_ = uVar3;
                local_15f0._12_4_ = uVar3;
                vpcmpeqd_avx2(ZEXT1632(local_15b0),ZEXT1632(local_15b0));
                uStack_159c = (local_16f0.context)->instID[0];
                local_15a0 = uStack_159c;
                uStack_1598 = uStack_159c;
                uStack_1594 = uStack_159c;
                uStack_1590 = (local_16f0.context)->instPrimID[0];
                uStack_158c = uStack_1590;
                uStack_1588 = uStack_1590;
                uStack_1584 = uStack_1590;
                local_1780 = *local_1768;
                local_16f0.valid = (int *)local_1780;
                local_16f0.geometryUserPtr = pGVar13->userPtr;
                local_16f0.hit = local_1610;
                local_16f0.N = 4;
                local_16f0.ray = (RTCRayN *)ray;
                uStack_15dc = local_15e0;
                uStack_15d8 = local_15e0;
                uStack_15d4 = local_15e0;
                if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar13->occlusionFilterN)(&local_16f0);
                }
                if (local_1780 == (undefined1  [16])0x0) {
                  auVar54 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar54 = auVar54 ^ _DAT_01f46b70;
                }
                else {
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var16)(&local_16f0);
                  }
                  auVar52 = vpcmpeqd_avx(local_1780,_DAT_01f45a50);
                  auVar54 = auVar52 ^ _DAT_01f46b70;
                  auVar60._8_4_ = 0xff800000;
                  auVar60._0_8_ = 0xff800000ff800000;
                  auVar60._12_4_ = 0xff800000;
                  auVar52 = vblendvps_avx(auVar60,*(undefined1 (*) [16])(local_16f0.ray + 0x80),
                                          auVar52);
                  *(undefined1 (*) [16])(local_16f0.ray + 0x80) = auVar52;
                }
                auVar52._8_8_ = 0x100000001;
                auVar52._0_8_ = 0x100000001;
                if ((auVar52 & auVar54) == (undefined1  [16])0x0) {
                  auVar67 = ZEXT3264(local_16c0);
                  *(int *)(ray + k * 4 + 0x80) = local_16c0._0_4_;
                  goto LAB_016815a4;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_0168162c;
            }
LAB_016815a4:
            uVar43 = uVar43 ^ 1L << (uVar48 & 0x3f);
          } while (uVar43 != 0);
        }
      }
      auVar67 = ZEXT3264(local_1460);
      auVar69 = ZEXT3264(local_1480);
      auVar72 = ZEXT3264(local_14a0);
      auVar76 = ZEXT3264(local_14c0);
      auVar82 = ZEXT3264(local_14e0);
      auVar84 = ZEXT3264(local_1500);
      auVar94 = ZEXT3264(local_1520);
      auVar98 = ZEXT3264(local_1540);
      uVar43 = local_1750;
      uVar48 = local_1758;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }